

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_arccurve.cpp
# Opt level: O2

bool __thiscall
ON_Arc::GetNurbFormParameterFromRadian(ON_Arc *this,double RadianParameter,double *NurbParameter)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int i_00;
  double *pdVar4;
  ON_3dPoint *pOVar5;
  ON_Plane *pOVar6;
  ON_3dVector *pOVar7;
  int i;
  long lVar8;
  ulong uVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double local_218;
  ON_Interval ADomain;
  ON_3dPoint cp;
  ON_NurbsCurve crv;
  ON_BezierCurve bez;
  ON_Interval BezDomain;
  double a [3];
  ON_Xform COC;
  
  bVar1 = IsValid(this);
  if (NurbParameter == (double *)0x0 || !bVar1) {
    return false;
  }
  ADomain = DomainRadians(this);
  pdVar4 = ON_Interval::operator[](&ADomain,0);
  dVar10 = *pdVar4;
  pdVar4 = ON_Interval::operator[](&ADomain,1);
  dVar10 = (ABS(*pdVar4) + ABS(dVar10)) * 2.220446049250313e-15;
  pdVar4 = ON_Interval::operator[](&ADomain,0);
  if ((RadianParameter - *pdVar4 <= dVar10) && (-1.490116119385e-08 <= RadianParameter - *pdVar4)) {
    iVar2 = 0;
LAB_003bb750:
    pdVar4 = ON_Interval::operator[](&ADomain,iVar2);
    *NurbParameter = *pdVar4;
    return true;
  }
  pdVar4 = ON_Interval::operator[](&ADomain,1);
  if ((*pdVar4 - RadianParameter <= dVar10) && (-1.490116119385e-08 <= *pdVar4 - RadianParameter)) {
    iVar2 = 1;
    goto LAB_003bb750;
  }
  bVar1 = ON_Interval::Includes(&ADomain,RadianParameter,false);
  if (!bVar1) {
    return false;
  }
  ON_NurbsCurve::ON_NurbsCurve(&crv);
  iVar2 = GetNurbForm(this,&crv);
  if (iVar2 == 0) {
    bVar1 = false;
    goto LAB_003bbd36;
  }
  iVar2 = ON_NurbsCurve::SpanCount(&crv);
  pdVar4 = ON_Interval::operator[](&ADomain,0);
  local_218 = *pdVar4;
  dVar10 = ON_NurbsCurve::Knot(&crv,0);
  ON_Curve::PointAt((ON_3dPoint *)a,&crv.super_ON_Curve,dVar10);
  pOVar5 = ON_Circle::Center(&this->super_ON_Circle);
  ON_3dPoint::operator-((ON_3dVector *)&COC,(ON_3dPoint *)a,pOVar5);
  ON_3dPoint::operator=(&cp,(ON_3dVector *)&COC);
  pOVar6 = ON_Circle::Plane(&this->super_ON_Circle);
  pOVar7 = ON_Plane::Xaxis(pOVar6);
  ON_3dVector::ON_3dVector((ON_3dVector *)&COC,&cp);
  dVar10 = ON_DotProduct(pOVar7,(ON_3dVector *)&COC);
  pOVar6 = ON_Circle::Plane(&this->super_ON_Circle);
  pOVar7 = ON_Plane::Yaxis(pOVar6);
  ON_3dVector::ON_3dVector((ON_3dVector *)&COC,&cp);
  dVar11 = ON_DotProduct(pOVar7,(ON_3dVector *)&COC);
  dVar10 = atan2(dVar11,dVar10);
  i_00 = 0;
  if (iVar2 < 1) {
    iVar2 = i_00;
  }
  while (bVar1 = iVar2 != 0, iVar2 = iVar2 + -1, bVar1) {
    dVar11 = ON_NurbsCurve::Knot(&crv,i_00 + 2);
    ON_Curve::PointAt((ON_3dPoint *)a,&crv.super_ON_Curve,dVar11);
    pOVar5 = ON_Circle::Center(&this->super_ON_Circle);
    ON_3dPoint::operator-((ON_3dVector *)&COC,(ON_3dPoint *)a,pOVar5);
    ON_3dPoint::operator=(&cp,(ON_3dVector *)&COC);
    pOVar6 = ON_Circle::Plane(&this->super_ON_Circle);
    pOVar7 = ON_Plane::Xaxis(pOVar6);
    ON_3dVector::ON_3dVector((ON_3dVector *)&COC,&cp);
    dVar11 = ON_DotProduct(pOVar7,(ON_3dVector *)&COC);
    pOVar6 = ON_Circle::Plane(&this->super_ON_Circle);
    pOVar7 = ON_Plane::Yaxis(pOVar6);
    ON_3dVector::ON_3dVector((ON_3dVector *)&COC,&cp);
    dVar12 = ON_DotProduct(pOVar7,(ON_3dVector *)&COC);
    dVar11 = atan2(dVar12,dVar11);
    local_218 = local_218 +
                ((double)(~-(ulong)(dVar10 < dVar11) & (ulong)(dVar11 + 6.283185307179586) |
                         -(ulong)(dVar10 < dVar11) & (ulong)dVar11) - dVar10);
    if (RadianParameter < local_218) break;
    iVar3 = ON_NurbsCurve::KnotMultiplicity(&crv,i_00);
    i_00 = iVar3 + i_00;
    dVar10 = dVar11;
  }
  iVar2 = ON_NurbsCurve::KnotCount(&crv);
  if (iVar2 <= i_00 + 2) {
    pdVar4 = ON_Interval::operator[](&ADomain,1);
    *NurbParameter = *pdVar4;
    bVar1 = true;
    goto LAB_003bbd36;
  }
  dVar10 = ON_NurbsCurve::Knot(&crv,i_00);
  dVar11 = ON_NurbsCurve::Knot(&crv,i_00 + 2);
  ON_Interval::ON_Interval(&BezDomain,dVar10,dVar11);
  ON_BezierCurve::ON_BezierCurve(&bez);
  bVar1 = ON_NurbsCurve::ConvertSpanToBezier(&crv,i_00,&bez);
  if (bVar1) {
    ON_Xform::ON_Xform(&COC);
    ON_Plane::ON_Plane((ON_Plane *)a);
    pOVar6 = ON_Circle::Plane(&this->super_ON_Circle);
    ON_Xform::ChangeBasis(&COC,(ON_Plane *)a,pOVar6);
    ON_Plane::~ON_Plane((ON_Plane *)a);
    ON_BezierCurve::Transform(&bez,&COC);
    for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
      dVar11 = tan(RadianParameter);
      pdVar4 = ON_BezierCurve::CV(&bez,(int)lVar8);
      dVar10 = *pdVar4;
      pdVar4 = ON_BezierCurve::CV(&bez,(int)lVar8);
      a[lVar8] = dVar11 * dVar10 - pdVar4[1];
    }
    dVar10 = (a[0] - (a[1] + a[1])) + a[2];
    if (ABS(dVar10) <= 2.3283064365386963e-10) {
      dVar11 = a[0] - a[2];
      if ((dVar11 != 0.0) || (NAN(dVar11))) {
        dVar11 = a[0] / dVar11;
        goto LAB_003bbcf3;
      }
LAB_003bbd0b:
      dVar10 = 1.0;
    }
    else {
      dVar12 = a[1] * a[1] - a[2] * a[0];
      ON_REMOVE_ASAP_AssertEx
                ((uint)(0.0 <= dVar12),
                 "/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_arccurve.cpp"
                 ,0x42d,"","descrim>=0 is false");
      if (dVar12 < 0.0) {
        dVar12 = sqrt(dVar12);
      }
      else {
        dVar12 = SQRT(dVar12);
      }
      dVar11 = ((a[0] - a[1]) + dVar12) / dVar10;
      if ((dVar11 < 0.0) || (1.0 < dVar11)) {
        dVar10 = ((a[0] - a[1]) - dVar12) / dVar10;
        uVar9 = -(ulong)(ABS(dVar10 + -0.5) < ABS(dVar11 + -0.5));
        dVar11 = (double)(~uVar9 & (ulong)dVar11 | (ulong)dVar10 & uVar9);
      }
      ON_REMOVE_ASAP_AssertEx
                (-(uint)(-2.3283064365386963e-10 <= dVar11 && dVar11 <= 1.0000000002328306) & 1,
                 "/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_arccurve.cpp"
                 ,0x436,"","tbez>=-ON_ZERO_TOLERANCE && tbez<=1+ON_ZERO_TOLERANCE is false");
LAB_003bbcf3:
      dVar10 = 0.0;
      if ((0.0 <= dVar11) && (dVar10 = dVar11, 1.0 < dVar11)) goto LAB_003bbd0b;
    }
    dVar10 = ON_Interval::ParameterAt(&BezDomain,dVar10);
    *NurbParameter = dVar10;
  }
  ON_BezierCurve::~ON_BezierCurve(&bez);
LAB_003bbd36:
  ON_NurbsCurve::~ON_NurbsCurve(&crv);
  return bVar1;
}

Assistant:

bool ON_Arc::GetNurbFormParameterFromRadian(double RadianParameter, double* NurbParameter ) const
{
	if(!IsValid() || NurbParameter==nullptr) 
		return false;

  ON_Interval ADomain = DomainRadians();

  double endtol = 10.0*ON_EPSILON*(fabs(ADomain[0]) + fabs(ADomain[1]));

  double del = RadianParameter - ADomain[0];
	if(del <= endtol && del >= -ON_SQRT_EPSILON)
  {
		*NurbParameter=ADomain[0];
		return true;
	} 
  else {
    del = ADomain[1] - RadianParameter;
    if(del <= endtol && del >= -ON_SQRT_EPSILON){
		  *NurbParameter=ADomain[1];
		  return true;
    }
	}

	if( !ADomain.Includes(RadianParameter ) )
		return false;


	ON_NurbsCurve crv;

	if( !GetNurbForm(crv))
		return false;

	//Isolate a bezier that contains the solution
	int cnt = crv.SpanCount();	
	int si =0;	//get span index
	int ki=0;		//knot index
	double ang = ADomain[0];
	ON_3dPoint cp;
	cp = crv.PointAt( crv.Knot(0) ) - Center();
	double x = ON_DotProduct(Plane().Xaxis(),cp);
	double y = ON_DotProduct(Plane().Yaxis(),cp);
	double at = atan2( y, x);	//todo make sure we dont go to far

	for( si=0, ki=0; si<cnt; si++, ki+=crv.KnotMultiplicity(ki) ){
		cp = crv.PointAt( crv.Knot(ki+2)) - Center();
		x = ON_DotProduct(Plane().Xaxis(),cp);
		y = ON_DotProduct(Plane().Yaxis(),cp);
		double at2 = atan2(y,x);
		if(at2>at)
			ang+=(at2-at);
		else
			ang += (2*ON_PI + at2 - at);
		at = at2;
		if( ang>RadianParameter)
			break;
	} 

	// Crash Protection trr#55679
	if( ki+2>= crv.KnotCount())
	{
		 *NurbParameter=ADomain[1];
		 return true;		
	}
	ON_Interval BezDomain(crv.Knot(ki), crv.Knot(ki+2));

	ON_BezierCurve bez;
	if(!crv.ConvertSpanToBezier(ki,bez))
		return false;

 	ON_Xform COC;
	COC.ChangeBasis( ON_Plane(),Plane());   

	
	bez.Transform(COC);	// change coordinates to circles local frame
	double a[3];							// Bez coefficients of a quadratic to solve
	for(int i=0; i<3; i++)
		a[i] = tan(RadianParameter)* bez.CV(i)[0] - bez.CV(i)[1];

	//Solve the Quadratic
	double descrim = (a[1]*a[1]) - a[0]*a[2];
	double squared = a[0]-2*a[1]+a[2];
	double tbez;
	if(fabs(squared)> ON_ZERO_TOLERANCE){
		ON_ASSERT(descrim>=0);
		descrim = sqrt(descrim);
		tbez = (a[0]-a[1] + descrim)/(a[0]-2*a[1]+a[2]);
		if( tbez<0 || tbez>1){
			double tbez2 = (a[0]-a[1]-descrim)/(a[0] - 2*a[1] + a[2]);
			if( fabs(tbez2 - .5)<fabs(tbez-.5) )
				tbez = tbez2;
		}

		ON_ASSERT(tbez>=-ON_ZERO_TOLERANCE && tbez<=1+ON_ZERO_TOLERANCE);
	}
	else{
		// Quadratic degenerates to linear
		tbez = 1.0;
		if(a[0]-a[2])
			tbez = a[0]/(a[0]-a[2]);
	}	
	if(tbez<0)
		tbez=0.0;
	else if(tbez>1.0)
		tbez=1.0;


		//Debug ONLY Code  - check the result
//		double aa = a[0]*(1-tbez)*(1-tbez)  + 2*a[1]*tbez*(1-tbez) + a[2]*tbez*tbez;
//		double tantheta= tan(RadianParameter);
//		ON_3dPoint bezp;
//		bez.Evaluate(tbez, 0, 3, bezp);
//		double yx = bezp.y/bezp.x;


	*NurbParameter = BezDomain.ParameterAt(tbez);
	return true;

}